

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

mcu8str * mcplcfg_show_item_lookup(nccfgstate *state,char *item)

{
  int iVar1;
  nccfgstate *in_RDX;
  nccfgstate *in_RDI;
  nccfgstate *unaff_retaddr;
  nccfgstate *in_stack_00000030;
  nccfgstate *state_00;
  
  state_00 = in_RDI;
  if ((*(char *)&(in_RDX->bindir).c_str == 's') &&
     (iVar1 = strncmp((char *)in_RDX,"shlibpath",10), iVar1 == 0)) {
    mcplcfg_shlibpath(unaff_retaddr);
    return &in_RDI->bindir;
  }
  if ((*(char *)&(in_RDX->bindir).c_str == 'l') &&
     (iVar1 = strncmp((char *)in_RDX,"libpath",8), iVar1 == 0)) {
    mcplcfg_libpath(unaff_retaddr);
    return &in_RDI->bindir;
  }
  if ((*(char *)&(in_RDX->bindir).c_str == 'v') &&
     (iVar1 = strncmp((char *)in_RDX,"version",8), iVar1 == 0)) {
    mcplcfg_const_version();
    mcu8str_view_cstr((char *)state_00);
    return &in_RDI->bindir;
  }
  if ((*(char *)&(in_RDX->bindir).c_str == 'i') &&
     (iVar1 = strncmp((char *)in_RDX,"intversion",0xb), iVar1 == 0)) {
    mcplcfg_const_intversion();
    mcu8str_view_cstr((char *)state_00);
    return &in_RDI->bindir;
  }
  if ((*(char *)&(in_RDX->bindir).c_str == 'b') &&
     (iVar1 = strncmp((char *)in_RDX,"bindir",7), iVar1 == 0)) {
    mcplcfg_bindir(state_00);
    return &in_RDI->bindir;
  }
  if ((*(char *)&(in_RDX->bindir).c_str == 'l') &&
     (iVar1 = strncmp((char *)in_RDX,"libdir",7), iVar1 == 0)) {
    mcplcfg_libdir(in_RDX);
    return &in_RDI->bindir;
  }
  if ((*(char *)&(in_RDX->bindir).c_str == 's') &&
     (iVar1 = strncmp((char *)in_RDX,"shlibdir",9), iVar1 == 0)) {
    mcplcfg_shlibdir(in_RDX);
    return &in_RDI->bindir;
  }
  if ((*(char *)&(in_RDX->bindir).c_str == 'i') &&
     (iVar1 = strncmp((char *)in_RDX,"includedir",0xb), iVar1 == 0)) {
    mcplcfg_incdir(in_RDX);
    return &in_RDI->bindir;
  }
  if ((*(char *)&(in_RDX->bindir).c_str == 'b') &&
     (iVar1 = strncmp((char *)in_RDX,"buildflags",0xb), iVar1 == 0)) {
    mcplcfg_buildflags(in_stack_00000030);
    return &in_RDI->bindir;
  }
  if ((*(char *)&(in_RDX->bindir).c_str == 'l') &&
     (iVar1 = strncmp((char *)in_RDX,"libname",8), iVar1 == 0)) {
    mcplcfg_const_libname();
    mcu8str_view_cstr((char *)state_00);
    return &in_RDI->bindir;
  }
  if ((*(char *)&(in_RDX->bindir).c_str == 's') &&
     (iVar1 = strncmp((char *)in_RDX,"shlibname",10), iVar1 == 0)) {
    mcplcfg_const_shlibname();
    mcu8str_view_cstr((char *)state_00);
    return &in_RDI->bindir;
  }
  if ((*(char *)&(in_RDX->bindir).c_str == 'c') &&
     (iVar1 = strncmp((char *)in_RDX,"cmakedir",9), iVar1 == 0)) {
    mcplcfg_cmakedir(in_RDX);
    return &in_RDI->bindir;
  }
  if ((*(char *)&(in_RDX->bindir).c_str == 'b') &&
     (iVar1 = strncmp((char *)in_RDX,"build_type",0xb), iVar1 == 0)) {
    mcplcfg_const_cmakebuildtype();
    mcu8str_view_cstr((char *)state_00);
    return &in_RDI->bindir;
  }
  (state_00->bindir).c_str = (char *)0x0;
  (state_00->bindir).buflen = 0;
  (state_00->bindir).size = 0;
  (state_00->bindir).owns_memory = 0;
  return &in_RDI->bindir;
}

Assistant:

mcu8str mcplcfg_show_item_lookup( nccfgstate* state,
                                const char* item )
{
  //Lookup string value of named item. Returns invalid string (with
  //c_str=nullptr) in case name not recognised. Synchronize with implementation
  //of mcplcfg_show_item_list function).

  //All options (libpath first since it might be used by e.g. the python
  //modules):
  if ( MCPLCFG_STREQUALCONST(item,"shlibpath") )
    return mcplcfg_shlibpath(state);

  if ( MCPLCFG_STREQUALCONST(item,"libpath") )
    return mcplcfg_libpath(state);

  /* if ( MCPLCFG_STREQUALCONST(item,"namespace") ) */
  /*   return mcu8str_view_cstr(mcplcfg_const_namespace()); */

  if ( MCPLCFG_STREQUALCONST(item,"version") )
    return mcu8str_view_cstr(mcplcfg_const_version());

  if ( MCPLCFG_STREQUALCONST(item,"intversion") )
    return mcu8str_view_cstr(mcplcfg_const_intversion());

  if ( MCPLCFG_STREQUALCONST(item,"bindir") )
    return mcplcfg_bindir(state);

  if ( MCPLCFG_STREQUALCONST(item,"libdir") )
    return mcplcfg_libdir(state);

  if ( MCPLCFG_STREQUALCONST(item,"shlibdir") )
    return mcplcfg_shlibdir(state);

  if ( MCPLCFG_STREQUALCONST(item,"includedir") )
    return mcplcfg_incdir(state);

  if ( MCPLCFG_STREQUALCONST(item,"buildflags") )
    return mcplcfg_buildflags( state );

  if ( MCPLCFG_STREQUALCONST(item,"libname") )
    return mcu8str_view_cstr(mcplcfg_const_libname());

  if ( MCPLCFG_STREQUALCONST(item,"shlibname") )
    return mcu8str_view_cstr(mcplcfg_const_shlibname());

  if ( MCPLCFG_STREQUALCONST(item,"cmakedir") )
    return mcplcfg_cmakedir(state);

  if ( MCPLCFG_STREQUALCONST(item,"build_type") )
    return mcu8str_view_cstr(mcplcfg_const_cmakebuildtype());

  //Get here on errors:
  mcu8str error;
  error.c_str = NULL;
  error.size = error.buflen = 0;
  error.owns_memory = 0;
  return error;
}